

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

BinaryenExpressionRef
BinaryenSelect(BinaryenModuleRef module,BinaryenExpressionRef condition,BinaryenExpressionRef ifTrue
              ,BinaryenExpressionRef ifFalse)

{
  Select *this;
  Select *ret;
  BinaryenExpressionRef ifFalse_local;
  BinaryenExpressionRef ifTrue_local;
  BinaryenExpressionRef condition_local;
  BinaryenModuleRef module_local;
  
  this = MixedArena::alloc<wasm::Select>(&module->allocator);
  this->condition = condition;
  this->ifTrue = ifTrue;
  this->ifFalse = ifFalse;
  wasm::Select::finalize(this);
  return (BinaryenExpressionRef)this;
}

Assistant:

BinaryenExpressionRef BinaryenSelect(BinaryenModuleRef module,
                                     BinaryenExpressionRef condition,
                                     BinaryenExpressionRef ifTrue,
                                     BinaryenExpressionRef ifFalse) {
  auto* ret = ((Module*)module)->allocator.alloc<Select>();
  ret->condition = (Expression*)condition;
  ret->ifTrue = (Expression*)ifTrue;
  ret->ifFalse = (Expression*)ifFalse;
  ret->finalize();
  return static_cast<Expression*>(ret);
}